

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

bool __thiscall QXmlStreamReaderPrivate::scanNData(QXmlStreamReaderPrivate *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  long lVar4;
  uint *puVar5;
  long lVar6;
  
  qVar3 = fastScanSpace(this);
  if (qVar3 != 0) {
    bVar2 = scanString(this,"NDATA",0x24,true);
    if (bVar2) {
      return true;
    }
    lVar4 = (this->putStack).tos;
    lVar1 = (this->putStack).cap;
    if (lVar1 <= lVar4 + 1) {
      lVar4 = lVar4 + 2;
      lVar6 = lVar1 * 2;
      if (lVar4 != lVar6 && SBORROW8(lVar4,lVar6) == lVar4 + lVar1 * -2 < 0) {
        lVar6 = lVar4;
      }
      (this->putStack).cap = lVar6;
      puVar5 = (uint *)realloc((this->putStack).data,lVar6 << 2);
      (this->putStack).data = puVar5;
      if (puVar5 == (uint *)0x0) {
        qBadAlloc();
      }
    }
    lVar4 = (this->putStack).tos;
    (this->putStack).tos = lVar4 + 1;
    (this->putStack).data[lVar4 + 1] = 0x20;
  }
  return false;
}

Assistant:

bool QXmlStreamReaderPrivate::scanNData()
{
    if (fastScanSpace()) {
        if (scanString(spell[NDATA], NDATA))
            return true;
        putChar(' ');
    }
    return false;
}